

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.h
# Opt level: O0

void __thiscall MeCab::Connector::Connector(Connector *this)

{
  undefined1 *this_00;
  Mmap<short> *this_01;
  whatlog *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Connector_00248670;
  this_00 = &in_RDI->field_0x8;
  this_01 = (Mmap<short> *)operator_new(0x1d8);
  Mmap<short>::Mmap(this_01);
  scoped_ptr<MeCab::Mmap<short>_>::scoped_ptr((scoped_ptr<MeCab::Mmap<short>_> *)this_00,this_01);
  *(undefined8 *)&in_RDI->field_0x18 = 0;
  *(undefined2 *)&in_RDI->field_0x20 = 0;
  *(undefined2 *)&in_RDI->field_0x22 = 0;
  whatlog::whatlog(in_RDI);
  return;
}

Assistant:

explicit Connector():
      cmmap_(new Mmap<short>), matrix_(0), lsize_(0), rsize_(0) {}